

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_node<char>::first_node
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  bool bVar1;
  char *p1;
  size_t size1;
  xml_node<char> *local_38;
  xml_node<char> *child;
  size_t sStack_28;
  bool case_sensitive_local;
  size_t name_size_local;
  char *name_local;
  xml_node<char> *this_local;
  
  if (name == (char *)0x0) {
    this_local = this->m_first_node;
  }
  else {
    sStack_28 = name_size;
    if (name_size == 0) {
      sStack_28 = internal::measure<char>(name);
    }
    for (local_38 = this->m_first_node; local_38 != (xml_node<char> *)0x0;
        local_38 = next_sibling(local_38,(char *)0x0,0,true)) {
      p1 = xml_base<char>::name(&local_38->super_xml_base<char>);
      size1 = xml_base<char>::name_size(&local_38->super_xml_base<char>);
      bVar1 = internal::compare<char>(p1,size1,name,sStack_28,case_sensitive);
      if (bVar1) {
        return local_38;
      }
    }
    this_local = (xml_node<char> *)0x0;
  }
  return this_local;
}

Assistant:

xml_node<Ch> *first_node(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *child = m_first_node; child; child = child->next_sibling())
                    if (internal::compare(child->name(), child->name_size(), name, name_size, case_sensitive))
                        return child;
                return 0;
            }
            else
                return m_first_node;
        }